

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentQLearner.cpp
# Opt level: O0

Index __thiscall AgentQLearner::getGreedyAction(AgentQLearner *this,Index sI)

{
  int iVar1;
  size_type sVar2;
  reference puVar3;
  undefined4 in_ESI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint i;
  const_iterator iter;
  uint iNr;
  double d;
  list<unsigned_int,_std::allocator<unsigned_int>_> actions;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  Index IVar6;
  list<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint local_54;
  iterator local_50;
  _List_const_iterator<unsigned_int> local_48;
  uint local_40;
  double local_30;
  list<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  Index in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fdeff);
  local_30 = getMaxState((AgentQLearner *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0);
  iVar1 = rand();
  auVar5 = ZEXT816(0x3e00000000000000);
  this_00 = (list<unsigned_int,_std::allocator<unsigned_int>_> *)
            ((double)iVar1 * 4.656612873077393e-10);
  sVar2 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
  auVar5 = vcvtusi2sd_avx512f(auVar5,sVar2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (double)this_00 * auVar5._0_8_;
  local_40 = vcvttsd2usi_avx512f(auVar4);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 ((list<unsigned_int,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_48,&local_50);
  for (local_54 = 0; local_54 < local_40; local_54 = local_54 + 1) {
    std::_List_const_iterator<unsigned_int>::operator++(&local_48,0);
  }
  puVar3 = std::_List_const_iterator<unsigned_int>::operator*
                     ((_List_const_iterator<unsigned_int> *)this_00);
  IVar6 = *puVar3;
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::~list
            ((list<unsigned_int,_std::allocator<unsigned_int>_> *)0x8fdfe7);
  return IVar6;
}

Assistant:

Index AgentQLearner::getGreedyAction(Index sI) const
{
    list<Index> actions;
    double d = getMaxState(sI, &actions);

    // count number of other q-values that are equal to the highest value
    // normally count = 1 so iNr will be zero and the highest one is picked
    unsigned iNr = (unsigned)(rand()/(RAND_MAX+1.0)*actions.size());

    list<Index>::const_iterator iter = actions.begin();
    for(unsigned i = 0; i < iNr; i++)
        iter++;

#if DEBUG_AgentQLearner
    cout << "choose greedy action " << *iter << " in state " << sI
         << " with value " << d << endl;
#endif

    return *iter;
}